

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int64_t roundAndPackUint64(flag zSign,uint64_t absZ0,uint64_t absZ1,float_status *status)

{
  bool local_43;
  bool local_42;
  bool local_41;
  flag increment;
  flag roundNearestEven;
  int8_t roundingMode;
  float_status *status_local;
  uint64_t absZ1_local;
  uint64_t absZ0_local;
  uint64_t uStack_10;
  flag zSign_local;
  
  switch(status->float_rounding_mode) {
  case '\0':
  case '\x04':
    local_43 = (long)absZ1 < 0;
    break;
  case '\x01':
    local_42 = zSign != '\0' && absZ1 != 0;
    local_43 = local_42;
    break;
  case '\x02':
    local_41 = zSign == '\0' && absZ1 != 0;
    local_43 = local_41;
    break;
  case '\x03':
    local_43 = false;
    break;
  case '\x05':
    local_43 = (absZ0 & 1) == 0 && absZ1 != 0;
    break;
  default:
    abort();
  }
  absZ1_local = absZ0;
  if (local_43) {
    if (absZ0 + 1 == 0) {
      float_raise_tricore('\x01',status);
      return -1;
    }
    absZ1_local = (long)(int)(((absZ1 & 0x7fffffffffffffff) == 0 &&
                              status->float_rounding_mode == '\0') ^ 0xffffffff) & absZ0 + 1;
  }
  if ((zSign == '\0') || (absZ1_local == 0)) {
    if (absZ1 != 0) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
    }
    uStack_10 = absZ1_local;
  }
  else {
    float_raise_tricore('\x01',status);
    uStack_10 = 0;
  }
  return uStack_10;
}

Assistant:

static int64_t roundAndPackUint64(flag zSign, uint64_t absZ0,
                                uint64_t absZ1, float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven, increment;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = (roundingMode == float_round_nearest_even);
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        increment = ((int64_t)absZ1 < 0);
        break;
    case float_round_to_zero:
        increment = 0;
        break;
    case float_round_up:
        increment = !zSign && absZ1;
        break;
    case float_round_down:
        increment = zSign && absZ1;
        break;
    case float_round_to_odd:
        increment = !(absZ0 & 1) && absZ1;
        break;
    default:
        abort();
    }
    if (increment) {
        ++absZ0;
        if (absZ0 == 0) {
            float_raise(float_flag_invalid, status);
            return UINT64_MAX;
        }
        absZ0 &= ~(((uint64_t)(absZ1<<1) == 0) & roundNearestEven);
    }

    if (zSign && absZ0) {
        float_raise(float_flag_invalid, status);
        return 0;
    }

    if (absZ1) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return absZ0;
}